

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parseReordering
          (CollationRuleParser *this,UnicodeString *raw,UErrorCode *errorCode)

{
  CollationData *data;
  CollationSettings *this_00;
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  CharString *this_01;
  char *word_00;
  int32_t *codes;
  undefined1 local_e0 [4];
  int32_t code;
  int32_t local_9c;
  undefined1 local_98 [4];
  int32_t limit;
  CharString word;
  undefined1 local_48 [8];
  UVector32 reorderCodes;
  int32_t i;
  UErrorCode *errorCode_local;
  UnicodeString *raw_local;
  CollationRuleParser *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    reorderCodes.elements._4_4_ = 7;
    iVar3 = UnicodeString::length(raw);
    if (iVar3 == 7) {
      CollationSettings::resetReordering(this->settings);
    }
    else {
      UVector32::UVector32((UVector32 *)local_48,errorCode);
      UVar2 = ::U_FAILURE(*errorCode);
      if (UVar2 == '\0') {
        CharString::CharString((CharString *)local_98);
        while (iVar1 = reorderCodes.elements._4_4_, iVar3 = UnicodeString::length(raw),
              iVar1 < iVar3) {
          reorderCodes.elements._4_4_ = reorderCodes.elements._4_4_ + 1;
          local_9c = UnicodeString::indexOf(raw,L' ',reorderCodes.elements._4_4_);
          if (local_9c < 0) {
            local_9c = UnicodeString::length(raw);
          }
          this_01 = CharString::clear((CharString *)local_98);
          UnicodeString::tempSubStringBetween
                    ((UnicodeString *)local_e0,raw,reorderCodes.elements._4_4_,local_9c);
          CharString::appendInvariantChars(this_01,(UnicodeString *)local_e0,errorCode);
          UnicodeString::~UnicodeString((UnicodeString *)local_e0);
          UVar2 = ::U_FAILURE(*errorCode);
          if (UVar2 != '\0') {
            word.len = 1;
            goto LAB_0029b8bf;
          }
          word_00 = CharString::data((CharString *)local_98);
          iVar3 = getReorderCode(word_00);
          if (iVar3 < 0) {
            setParseError(this,"unknown script or reorder code",errorCode);
            word.len = 1;
            goto LAB_0029b8bf;
          }
          UVector32::addElement((UVector32 *)local_48,iVar3,errorCode);
          UVar2 = ::U_FAILURE(*errorCode);
          if (UVar2 != '\0') {
            word.len = 1;
            goto LAB_0029b8bf;
          }
          reorderCodes.elements._4_4_ = local_9c;
        }
        data = this->baseData;
        this_00 = this->settings;
        codes = UVector32::getBuffer((UVector32 *)local_48);
        iVar3 = UVector32::size((UVector32 *)local_48);
        CollationSettings::setReordering(this_00,data,codes,iVar3,errorCode);
        word.len = 0;
LAB_0029b8bf:
        CharString::~CharString((CharString *)local_98);
      }
      else {
        word.len = 1;
      }
      UVector32::~UVector32((UVector32 *)local_48);
    }
  }
  return;
}

Assistant:

void
CollationRuleParser::parseReordering(const UnicodeString &raw, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t i = 7;  // after "reorder"
    if(i == raw.length()) {
        // empty [reorder] with no codes
        settings->resetReordering();
        return;
    }
    // Parse the codes in [reorder aa bb cc].
    UVector32 reorderCodes(errorCode);
    if(U_FAILURE(errorCode)) { return; }
    CharString word;
    while(i < raw.length()) {
        ++i;  // skip the word-separating space
        int32_t limit = raw.indexOf((UChar)0x20, i);
        if(limit < 0) { limit = raw.length(); }
        word.clear().appendInvariantChars(raw.tempSubStringBetween(i, limit), errorCode);
        if(U_FAILURE(errorCode)) { return; }
        int32_t code = getReorderCode(word.data());
        if(code < 0) {
            setParseError("unknown script or reorder code", errorCode);
            return;
        }
        reorderCodes.addElement(code, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        i = limit;
    }
    settings->setReordering(*baseData, reorderCodes.getBuffer(), reorderCodes.size(), errorCode);
}